

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nameset.cpp
# Opt level: O0

void __thiscall soplex::NameSet::~NameSet(NameSet *this)

{
  DataSet<int> *in_RDI;
  
  spx_free<char*>((char **)0x7de9ec);
  DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::~DataHashTable
            ((DataHashTable<soplex::NameSet::Name,_soplex::DataKey> *)0x7de9fc);
  DataSet<int>::~DataSet(in_RDI);
  return;
}

Assistant:

NameSet::~NameSet()
{
   spx_free(mem);
}